

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_utils.cpp
# Opt level: O1

void Redistribution::MakeStateRedistUtils
               (Box *bx,Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *ccent,Array4<const_int> *itracker,Array4<double> *nrs,
               Array4<double> *alpha,Array4<double> *nbhd_vol,Array4<double> *cent_hat,
               Geometry *lev_geom,Real target_vol)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  EBCellFlag *pEVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  double *pdVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  long lVar72;
  int iVar73;
  int iVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  long lVar81;
  int *piVar82;
  long lVar83;
  int *piVar84;
  int iVar85;
  long lVar86;
  double *pdVar87;
  long lVar88;
  long lVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  undefined4 *puVar94;
  int iVar95;
  long lVar96;
  int *piVar97;
  double **ppdVar98;
  undefined8 *puVar99;
  long *plVar100;
  undefined4 *puVar101;
  int iVar102;
  int iVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  int iVar107;
  long lVar108;
  long lVar109;
  ulong uVar110;
  long lVar111;
  int iVar112;
  long lVar113;
  bool bVar114;
  long local_608;
  int local_600;
  int *local_5c8;
  long local_5c0;
  int *local_5b8;
  int local_5b0;
  int *local_5a8;
  int *local_588;
  int *local_578;
  int *local_560;
  long local_558;
  int *local_508;
  int *local_500;
  int local_378;
  int iStack_374;
  int iStack_370;
  double *local_358;
  long lStack_350;
  long local_348;
  Long LStack_340;
  undefined8 local_338;
  int iStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined8 uStack_324;
  double *local_318;
  long lStack_310;
  long local_308;
  Long LStack_300;
  undefined8 local_2f8;
  int iStack_2f0;
  int aiStack_2ec [2];
  undefined8 uStack_2e4;
  double *local_2d8;
  long lStack_2d0;
  long local_2c8;
  Long LStack_2c0;
  undefined8 local_2b8;
  int iStack_2b0;
  int aiStack_2ac [2];
  undefined8 uStack_2a4;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  int iStack_270;
  int iStack_26c;
  int local_268;
  uint local_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  long lStack_258;
  long local_250;
  long lStack_248;
  undefined8 local_240;
  int iStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined8 uStack_22c;
  int local_220 [4];
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  uint local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec [5];
  double *local_1d8;
  double *pdStack_1d0;
  long local_1c8;
  Long LStack_1c0;
  undefined8 local_1b8;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 uStack_1a0;
  undefined8 uStack_19c;
  double *local_190;
  long lStack_188;
  long local_180;
  Long LStack_178;
  undefined8 local_170;
  int iStack_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined8 uStack_15c;
  int local_148 [14];
  double *local_110;
  long lStack_108;
  long local_100;
  long lStack_f8;
  undefined8 local_f0;
  int iStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  Real RStack_d0;
  long local_c8;
  Long LStack_c0;
  undefined8 local_b8;
  int local_b0;
  undefined4 local_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  double *local_98;
  long lStack_90;
  long local_88;
  Long LStack_80;
  undefined8 local_78;
  int iStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  Array4<const_double> *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_50 = ccent;
  iVar68 = (bx->smallend).vect[0];
  iVar90 = (lev_geom->domain).smallend.vect[0];
  iVar92 = (lev_geom->domain).smallend.vect[1];
  iVar69 = (lev_geom->domain).smallend.vect[2];
  iVar102 = (lev_geom->domain).bigend.vect[0];
  iVar91 = (lev_geom->domain).bigend.vect[1];
  iVar78 = (lev_geom->domain).bigend.vect[2];
  bVar114 = (lev_geom->super_CoordSys).field_0x51 == '\0';
  iVar85 = iVar102 + 2;
  if (bVar114) {
    iVar85 = iVar102;
  }
  iVar102 = iVar90 + -2;
  if (bVar114) {
    iVar102 = iVar90;
  }
  bVar114 = (lev_geom->super_CoordSys).field_0x52 == '\0';
  iVar90 = iVar91 + 2;
  if (bVar114) {
    iVar90 = iVar91;
  }
  iVar91 = iVar92 + -2;
  if (bVar114) {
    iVar91 = iVar92;
  }
  bVar114 = (lev_geom->super_CoordSys).field_0x53 == '\0';
  iVar92 = iVar78 + 2;
  if (bVar114) {
    iVar92 = iVar78;
  }
  iVar78 = iVar69 + -2;
  if (bVar114) {
    iVar78 = iVar69;
  }
  iVar69 = (bx->smallend).vect[1];
  iVar70 = (bx->smallend).vect[2];
  iVar4 = (bx->bigend).vect[0];
  iVar71 = (bx->bigend).vect[1];
  iVar95 = (bx->bigend).vect[2];
  uVar5 = (bx->btype).itype;
  uVar6 = (lev_geom->domain).btype.itype;
  iVar61 = iVar68 + -3;
  iVar62 = iVar69 + -3;
  iVar73 = iVar70 + -3;
  iVar63 = iVar4 + 3;
  iVar64 = iVar71 + 3;
  iVar65 = iVar95 + 3;
  iVar79 = iVar71 + 4;
  if (iVar73 <= iVar65) {
    lVar8 = nrs->jstride;
    lVar77 = nrs->kstride;
    iVar66 = (nrs->begin).z;
    pdVar9 = alpha->p;
    lVar76 = alpha->kstride;
    lVar83 = alpha->nstride;
    iVar67 = (alpha->begin).z;
    lVar86 = (long)(alpha->begin).x;
    iVar74 = (nrs->begin).y;
    lVar81 = (long)iVar62;
    lVar1 = (long)iVar61 * 8 + (lVar81 - (alpha->begin).y) * alpha->jstride * 8;
    iVar80 = (nrs->begin).x;
    lVar93 = alpha->jstride * 8;
    pdVar10 = nrs->p;
    iVar107 = iVar73;
    do {
      if (iVar62 <= iVar64) {
        lVar88 = ((long)iVar107 - (long)iVar67) * lVar76 * 8;
        lVar75 = (long)pdVar9 + lVar88 + lVar1 + lVar83 * 8 + lVar86 * -8;
        lVar89 = (long)pdVar9 + lVar88 + lVar1 + lVar86 * -8;
        lVar111 = (long)pdVar10 +
                  ((long)iVar107 - (long)iVar66) * lVar77 * 8 +
                  (long)iVar61 * 8 + (lVar81 - iVar74) * lVar8 * 8 + (long)iVar80 * -8;
        lVar88 = lVar81;
        do {
          if (iVar61 <= iVar63) {
            lVar96 = 0;
            do {
              *(undefined8 *)(lVar111 + lVar96 * 8) = 0x3ff0000000000000;
              *(undefined8 *)(lVar89 + lVar96 * 8) = 0x3ff0000000000000;
              *(undefined8 *)(lVar75 + lVar96 * 8) = 0x3ff0000000000000;
              lVar96 = lVar96 + 1;
            } while ((iVar4 - iVar68) + 7 != (int)lVar96);
          }
          lVar88 = lVar88 + 1;
          lVar75 = lVar75 + lVar93;
          lVar89 = lVar89 + lVar93;
          lVar111 = lVar111 + lVar8 * 8;
        } while (iVar79 != (int)lVar88);
      }
      bVar114 = iVar107 != iVar65;
      iVar107 = iVar107 + 1;
    } while (bVar114);
  }
  iVar66 = iVar70 + -2;
  iVar67 = iVar95 + 2;
  piVar84 = itracker->p;
  lVar1 = itracker->jstride;
  lVar8 = itracker->kstride;
  lVar77 = itracker->nstride;
  uVar14 = (itracker->begin).x;
  uVar15 = (itracker->begin).y;
  iStack_370 = (int)*(undefined8 *)&(itracker->begin).z;
  puVar94 = &DAT_006a4a30;
  ppdVar98 = &local_358;
  for (lVar76 = 0x1b; lVar76 != 0; lVar76 = lVar76 + -1) {
    *(undefined4 *)ppdVar98 = *puVar94;
    puVar94 = puVar94 + 1;
    ppdVar98 = (double **)((long)ppdVar98 + 4);
  }
  piVar82 = &DAT_006a4a9c;
  piVar97 = aiStack_2ec;
  for (lVar76 = 0x1b; lVar76 != 0; lVar76 = lVar76 + -1) {
    *piVar97 = *piVar82;
    piVar82 = piVar82 + 1;
    piVar97 = piVar97 + 1;
  }
  puVar94 = &DAT_006a4b08;
  puVar99 = &uStack_280;
  for (lVar76 = 0x1b; lVar76 != 0; lVar76 = lVar76 + -1) {
    *(undefined4 *)puVar99 = *puVar94;
    puVar94 = puVar94 + 1;
    puVar99 = (undefined8 *)((long)puVar99 + 4);
  }
  local_220[3] = iVar102;
  local_210 = iVar91;
  local_20c = iVar78;
  local_208 = iVar85;
  local_204 = iVar90;
  local_200 = iVar92;
  local_1fc = uVar6;
  local_1f8 = iVar61;
  local_1f4 = iVar62;
  local_1f0 = iVar73;
  local_1ec[0] = iVar63;
  local_1ec[1] = iVar64;
  local_1ec[2] = iVar65;
  local_1ec[3] = uVar5;
  local_1d8 = nrs->p;
  pdStack_1d0 = (double *)nrs->jstride;
  local_1c8 = nrs->kstride;
  local_1b8._0_4_ = (nrs->begin).x;
  local_1b8._4_4_ = (nrs->begin).y;
  uVar16 = (nrs->end).x;
  uVar17 = (nrs->end).y;
  uVar18 = *(undefined8 *)&(nrs->end).z;
  LStack_1c0 = nrs->nstride;
  iStack_1b0 = (int)*(undefined8 *)&(nrs->begin).z;
  iStack_1ac = uVar16;
  local_1a8 = uVar17;
  local_1a4 = (undefined4)uVar18;
  uStack_1a0 = (undefined4)((ulong)uVar18 >> 0x20);
  if (iVar70 + -4 <= iVar95 + 4) {
    iVar74 = iVar68 + -4;
    iVar80 = iVar69 + -4;
    iVar70 = iVar70 + -4;
    do {
      if (iVar80 <= iVar79) {
        lVar76 = (long)iVar70;
        local_5b8 = (int *)((long)piVar84 +
                           (lVar76 - iStack_370) * lVar8 * 4 +
                           lVar77 * 4 + ((long)iVar80 - (long)(int)uVar15) * lVar1 * 4 +
                           (long)iVar74 * 4 + (long)(int)uVar14 * -4);
        local_5c0 = (long)iVar80;
        do {
          if (iVar74 <= iVar4 + 4) {
            local_588 = local_5b8;
            lVar83 = (long)iVar74;
            do {
              uVar7 = piVar84[(lVar76 - iStack_370) * lVar8 +
                              (local_5c0 - (int)uVar15) * lVar1 + (lVar83 - (int)uVar14)];
              uVar110 = (ulong)uVar7;
              if (0 < (int)uVar7) {
                local_600 = (int)lVar83;
                piVar82 = local_588;
                do {
                  lVar81 = (long)*piVar82;
                  lVar86 = (long)*(int *)((long)&local_358 + lVar81 * 4) + (long)local_600;
                  iVar107 = (int)lVar86;
                  if (iVar102 <= iVar107) {
                    lVar93 = (long)aiStack_2ec[lVar81] + (long)(int)local_5c0;
                    iVar112 = (int)lVar93;
                    if (iVar91 <= iVar112) {
                      lVar81 = *(int *)((long)&uStack_280 + lVar81 * 4) + lVar76;
                      iVar103 = (int)lVar81;
                      if (((((iVar78 <= iVar103) && (iVar107 <= iVar85)) && (iVar112 <= iVar90)) &&
                          ((((iVar103 <= iVar92 && (iVar61 <= iVar107)) &&
                            ((iVar62 <= iVar112 && ((iVar73 <= iVar103 && (iVar107 <= iVar63))))))
                           && (iVar112 <= iVar64)))) && (iVar103 <= iVar65)) {
                        lVar86 = lVar86 - (int)(undefined4)local_1b8;
                        lVar93 = (lVar93 - (int)local_1b8._4_4_) * (long)pdStack_1d0;
                        lVar81 = (lVar81 - iStack_1b0) * local_1c8;
                        local_1d8[lVar93 + lVar86 + lVar81] =
                             local_1d8[lVar93 + lVar86 + lVar81] + 1.0;
                      }
                    }
                  }
                  piVar82 = piVar82 + lVar77;
                  uVar110 = uVar110 - 1;
                } while (uVar110 != 0);
              }
              lVar83 = lVar83 + 1;
              local_588 = local_588 + 1;
            } while (iVar4 + 5 != (int)lVar83);
          }
          local_5c0 = local_5c0 + 1;
          local_5b8 = local_5b8 + lVar1;
        } while (iVar71 + 5 != (int)local_5c0);
      }
      bVar114 = iVar70 != iVar95 + 4;
      iVar70 = iVar70 + 1;
    } while (bVar114);
  }
  pEVar19 = flag->p;
  lVar1 = flag->jstride;
  lVar8 = flag->kstride;
  uVar20 = (flag->begin).x;
  uVar21 = (flag->begin).y;
  iStack_370 = (int)*(undefined8 *)&(flag->begin).z;
  local_358 = nbhd_vol->p;
  lStack_350 = nbhd_vol->jstride;
  local_348 = nbhd_vol->kstride;
  local_338._0_4_ = (nbhd_vol->begin).x;
  local_338._4_4_ = (nbhd_vol->begin).y;
  uVar18 = *(undefined8 *)&(nbhd_vol->begin).z;
  uVar22 = (nbhd_vol->end).y;
  uStack_328 = uVar22;
  uStack_324 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_330 = (int)uVar18;
  uStack_32c = (undefined4)((ulong)uVar18 >> 0x20);
  LStack_340 = nbhd_vol->nstride;
  local_318 = vfrac->p;
  lStack_310 = vfrac->jstride;
  local_308 = vfrac->kstride;
  local_2f8._0_4_ = (vfrac->begin).x;
  local_2f8._4_4_ = (vfrac->begin).y;
  uVar23 = (vfrac->end).x;
  uVar24 = (vfrac->end).y;
  LStack_300 = vfrac->nstride;
  iStack_2f0 = (int)*(undefined8 *)&(vfrac->begin).z;
  aiStack_2ec[0] = uVar23;
  aiStack_2ec[1] = uVar24;
  uStack_2e4 = *(undefined8 *)&(vfrac->end).z;
  local_2d8 = nrs->p;
  lStack_2d0 = nrs->jstride;
  local_2c8 = nrs->kstride;
  local_2b8._0_4_ = (nrs->begin).x;
  local_2b8._4_4_ = (nrs->begin).y;
  uVar25 = (nrs->end).x;
  uVar26 = (nrs->end).y;
  LStack_2c0 = nrs->nstride;
  iStack_2b0 = (int)*(undefined8 *)&(nrs->begin).z;
  aiStack_2ac[0] = uVar25;
  aiStack_2ac[1] = uVar26;
  uStack_2a4 = *(undefined8 *)&(nrs->end).z;
  local_298 = itracker->p;
  uStack_290 = itracker->jstride;
  local_288 = itracker->kstride;
  uStack_280 = itracker->nstride;
  local_278._0_4_ = (itracker->begin).x;
  local_278._4_4_ = (itracker->begin).y;
  uVar27 = (itracker->end).x;
  uVar28 = (itracker->end).y;
  uVar18 = *(undefined8 *)&(itracker->end).z;
  iStack_270 = (int)*(undefined8 *)&(itracker->begin).z;
  iStack_26c = uVar27;
  local_268 = uVar28;
  local_264 = (uint)uVar18;
  local_260 = (undefined4)((ulong)uVar18 >> 0x20);
  puVar94 = &DAT_006a4a30;
  plVar100 = &lStack_258;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  piVar84 = &DAT_006a4a9c;
  piVar82 = local_1ec;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *piVar82 = *piVar84;
    piVar84 = piVar84 + 1;
    piVar82 = piVar82 + 1;
  }
  puVar94 = &DAT_006a4b08;
  plVar100 = &local_180;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  local_110 = alpha->p;
  lStack_108 = alpha->jstride;
  local_100 = alpha->kstride;
  lStack_f8 = alpha->nstride;
  local_f0._0_4_ = (alpha->begin).x;
  local_f0._4_4_ = (alpha->begin).y;
  uVar18 = *(undefined8 *)&(alpha->begin).z;
  uVar29 = (alpha->end).y;
  uVar30 = *(undefined8 *)&(alpha->end).z;
  uStack_e0 = uVar29;
  uStack_dc = (undefined4)uVar30;
  uStack_d8 = (undefined4)((ulong)uVar30 >> 0x20);
  iStack_e8 = (int)uVar18;
  uStack_e4 = (undefined4)((ulong)uVar18 >> 0x20);
  RStack_d0 = target_vol;
  iVar68 = iVar68 + -2;
  iVar69 = iVar69 + -2;
  iVar70 = iVar4 + 2;
  iVar71 = iVar71 + 2;
  if (iVar66 <= iVar67) {
    local_38 = (long)iStack_e8;
    local_40 = local_100;
    local_48 = local_288 * 4;
    iVar95 = iVar66;
    do {
      if (iVar69 <= iVar71) {
        lVar81 = (long)iVar95;
        local_578 = (int *)((long)local_298 +
                           (lVar81 - iStack_270) * local_288 * 4 +
                           uStack_280 * 4 +
                           ((long)iVar69 - (long)(int)local_278._4_4_) * uStack_290 * 4 +
                           (long)iVar68 * 4 + (long)(int)(undefined4)local_278 * -4);
        lVar76 = (iVar95 - iStack_2f0) * local_308;
        lVar83 = (lVar81 - iStack_330) * local_348;
        lVar86 = (lVar81 - iStack_e8) * local_100;
        lVar77 = (long)iVar69;
        do {
          if (iVar68 <= iVar70) {
            lVar75 = (lVar77 - (int)local_2f8._4_4_) * lStack_310;
            lVar88 = (lVar77 - (int)local_338._4_4_) * lStack_350;
            lVar89 = (lVar77 - (int)local_f0._4_4_) * lStack_108;
            local_5a8 = local_578;
            lVar93 = (long)iVar68;
            do {
              if ((~pEVar19[(lVar81 - iStack_370) * lVar8 +
                            (lVar77 - (int)uVar21) * lVar1 + (lVar93 - (int)uVar20)].flag & 3) == 0)
              {
                local_358[lVar83 + lVar88 + (lVar93 - (int)(undefined4)local_338)] = 0.0;
                local_110[lVar86 + lVar89 + (lVar93 - (int)(undefined4)local_f0)] = 0.0;
                (local_110 + lVar86 + lVar89 + (lVar93 - (int)(undefined4)local_f0))[lStack_f8] =
                     0.0;
              }
              else {
                dVar11 = local_318[lVar76 + lVar75 + (lVar93 - (int)(undefined4)local_2f8)] /
                         local_2d8[(iVar95 - iStack_2b0) * local_2c8 +
                                   (lVar77 - (int)local_2b8._4_4_) * lStack_2d0 +
                                   (lVar93 - (int)(undefined4)local_2b8)];
                lVar111 = lVar93 - (int)(undefined4)local_338;
                local_358[lVar83 + lVar88 + lVar111] = dVar11;
                uVar7 = local_298[(lVar81 - iStack_270) * local_288 +
                                  (lVar77 - (int)local_278._4_4_) * uStack_290 +
                                  (lVar93 - (int)(undefined4)local_278)];
                uVar110 = (ulong)uVar7;
                dVar13 = 0.0;
                dVar12 = 0.0;
                piVar84 = local_5a8;
                if (0 < (int)uVar7) {
                  do {
                    lVar96 = (long)*piVar84;
                    iVar74 = *(int *)((long)&lStack_258 + lVar96 * 4) + (int)lVar93;
                    iVar107 = local_1ec[lVar96] + (int)lVar77;
                    iVar80 = *(int *)((long)&local_180 + lVar96 * 4) + iVar95;
                    lVar106 = (long)(iVar74 - (undefined4)local_2f8);
                    lVar96 = (iVar107 - local_2f8._4_4_) * lStack_310;
                    lVar72 = (iVar80 - iStack_2f0) * local_308;
                    dVar11 = dVar11 + local_318[lVar96 + lVar106 + lVar72] /
                                      local_2d8[(iVar107 - local_2b8._4_4_) * lStack_2d0 +
                                                (long)(iVar74 - (undefined4)local_2b8) +
                                                (iVar80 - iStack_2b0) * local_2c8];
                    local_358[lVar83 + lVar88 + lVar111] = dVar11;
                    dVar12 = dVar13 + local_318[lVar96 + lVar106 + lVar72];
                    uVar110 = uVar110 - 1;
                    piVar84 = piVar84 + uStack_280;
                    dVar13 = dVar12;
                  } while (uVar110 != 0);
                }
                if (0 < (int)uVar7) {
                  local_110[lVar86 + lVar89 + lStack_f8 + (lVar93 - (int)(undefined4)local_f0)] =
                       (target_vol -
                       local_318[lVar76 + lVar75 + (lVar93 - (int)(undefined4)local_2f8)]) / dVar12;
                }
              }
              lVar93 = lVar93 + 1;
              local_5a8 = local_5a8 + 1;
            } while (iVar63 != (int)lVar93);
          }
          lVar77 = lVar77 + 1;
          local_578 = local_578 + uStack_290;
        } while (iVar64 != (int)lVar77);
      }
      bVar114 = iVar95 != iVar67;
      iVar95 = iVar95 + 1;
    } while (bVar114);
  }
  pEVar19 = flag->p;
  lVar1 = flag->jstride;
  lVar8 = flag->kstride;
  uVar31 = (flag->begin).x;
  uVar32 = (flag->begin).y;
  iStack_370 = (int)*(undefined8 *)&(flag->begin).z;
  local_358 = (double *)itracker->p;
  lStack_350 = itracker->jstride;
  local_348 = itracker->kstride;
  LStack_340 = itracker->nstride;
  local_338._0_4_ = (itracker->begin).x;
  local_338._4_4_ = (itracker->begin).y;
  uVar33 = (itracker->end).x;
  uVar34 = (itracker->end).y;
  iStack_330 = (int)*(undefined8 *)&(itracker->begin).z;
  uStack_32c = uVar33;
  uStack_328 = uVar34;
  uStack_324 = *(undefined8 *)&(itracker->end).z;
  puVar94 = &DAT_006a4a30;
  ppdVar98 = &local_318;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)ppdVar98 = *puVar94;
    puVar94 = puVar94 + 1;
    ppdVar98 = (double **)((long)ppdVar98 + 4);
  }
  piVar84 = &DAT_006a4a9c;
  piVar82 = aiStack_2ac;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *piVar82 = *piVar84;
    piVar84 = piVar84 + 1;
    piVar82 = piVar82 + 1;
  }
  puVar94 = &DAT_006a4b08;
  puVar99 = &local_240;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)puVar99 = *puVar94;
    puVar94 = puVar94 + 1;
    puVar99 = (undefined8 *)((long)puVar99 + 4);
  }
  pdStack_1d0 = alpha->p;
  local_1c8 = alpha->jstride;
  LStack_1c0 = alpha->kstride;
  local_1b8 = alpha->nstride;
  uVar35 = (alpha->begin).x;
  uVar36 = (alpha->begin).y;
  uVar18 = *(undefined8 *)&(alpha->begin).z;
  uVar37 = (alpha->end).y;
  uStack_1a0 = uVar37;
  uStack_19c = *(undefined8 *)&(alpha->end).z;
  iStack_1b0 = uVar35;
  iStack_1ac = uVar36;
  local_1a8 = (int)uVar18;
  local_1a4 = (undefined4)((ulong)uVar18 >> 0x20);
  local_190 = nrs->p;
  lStack_188 = nrs->jstride;
  local_180 = nrs->kstride;
  local_170._0_4_ = (nrs->begin).x;
  local_170._4_4_ = (nrs->begin).y;
  uVar38 = (nrs->end).x;
  uVar39 = (nrs->end).y;
  LStack_178 = nrs->nstride;
  iStack_168 = (int)*(undefined8 *)&(nrs->begin).z;
  uStack_164 = uVar38;
  uStack_160 = uVar39;
  uStack_15c = *(undefined8 *)&(nrs->end).z;
  if (iVar66 <= iVar67) {
    iVar95 = iVar66;
    do {
      if (iVar69 <= iVar71) {
        lVar77 = (long)iVar95;
        local_5c8 = (int *)((long)local_358 +
                           (lVar77 - iStack_330) * local_348 * 4 +
                           LStack_340 * 4 +
                           ((long)iVar69 - (long)(int)local_338._4_4_) * lStack_350 * 4 +
                           (long)iVar68 * 4 + (long)(int)(undefined4)local_338 * -4);
        local_558 = (long)iVar69;
        do {
          if (iVar68 <= iVar70) {
            local_500 = local_5c8;
            lVar76 = (long)iVar68;
            do {
              if (((~pEVar19[(lVar77 - iStack_370) * lVar8 +
                             (local_558 - (int)uVar32) * lVar1 + (lVar76 - (int)uVar31)].flag & 3)
                   != 0) &&
                 (uVar7 = *(uint *)((long)local_358 +
                                   ((lVar77 - iStack_330) * local_348 +
                                   (local_558 - (int)local_338._4_4_) * lStack_350 +
                                   (lVar76 - (int)(undefined4)local_338)) * 4),
                 uVar110 = (ulong)uVar7, 0 < (int)uVar7)) {
                piVar84 = local_500;
                do {
                  lVar81 = (long)*piVar84;
                  lVar93 = (long)*(int *)((long)&local_318 + lVar81 * 4) + (long)(int)lVar76;
                  lVar83 = (long)aiStack_2ac[lVar81] + (long)(int)local_558;
                  lVar86 = *(int *)((long)&local_240 + lVar81 * 4) + lVar77;
                  lVar81 = (long)((int)lVar93 - iStack_1b0);
                  lVar88 = ((int)lVar83 - iStack_1ac) * local_1c8;
                  lVar75 = ((int)lVar86 - local_1a8) * LStack_1c0;
                  pdStack_1d0[lVar88 + lVar81 + lVar75] =
                       pdStack_1d0[lVar88 + lVar81 + lVar75] -
                       pdStack_1d0
                       [local_1b8 +
                        (iVar95 - local_1a8) * LStack_1c0 +
                        (local_558 - iStack_1ac) * local_1c8 + (lVar76 - iStack_1b0)] /
                       local_190[(lVar83 - (int)local_170._4_4_) * lStack_188 +
                                 (lVar93 - (int)(undefined4)local_170) +
                                 (lVar86 - iStack_168) * local_180];
                  piVar84 = piVar84 + LStack_340;
                  uVar110 = uVar110 - 1;
                } while (uVar110 != 0);
              }
              lVar76 = lVar76 + 1;
              local_500 = local_500 + 1;
            } while (iVar63 != (int)lVar76);
          }
          local_558 = local_558 + 1;
          local_5c8 = local_5c8 + lStack_350;
        } while (iVar64 != (int)local_558);
      }
      bVar114 = iVar95 != iVar67;
      iVar95 = iVar95 + 1;
    } while (bVar114);
  }
  pEVar19 = flag->p;
  lVar1 = flag->jstride;
  lVar8 = flag->kstride;
  uVar40 = (flag->begin).x;
  uVar41 = (flag->begin).y;
  iStack_370 = (int)*(undefined8 *)&(flag->begin).z;
  local_358 = nbhd_vol->p;
  lStack_350 = nbhd_vol->jstride;
  local_348 = nbhd_vol->kstride;
  local_338._0_4_ = (nbhd_vol->begin).x;
  local_338._4_4_ = (nbhd_vol->begin).y;
  uVar18 = *(undefined8 *)&(nbhd_vol->begin).z;
  uVar42 = (nbhd_vol->end).y;
  uStack_328 = uVar42;
  uStack_324 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_330 = (int)uVar18;
  uStack_32c = (undefined4)((ulong)uVar18 >> 0x20);
  LStack_340 = nbhd_vol->nstride;
  local_318 = alpha->p;
  lStack_310 = alpha->jstride;
  local_308 = alpha->kstride;
  LStack_300 = alpha->nstride;
  local_2f8._0_4_ = (alpha->begin).x;
  local_2f8._4_4_ = (alpha->begin).y;
  uVar43 = (alpha->end).x;
  uVar44 = (alpha->end).y;
  iStack_2f0 = (int)*(undefined8 *)&(alpha->begin).z;
  aiStack_2ec[0] = uVar43;
  aiStack_2ec[1] = uVar44;
  uStack_2e4 = *(undefined8 *)&(alpha->end).z;
  local_2d8 = vfrac->p;
  lStack_2d0 = vfrac->jstride;
  local_2c8 = vfrac->kstride;
  local_2b8._0_4_ = (vfrac->begin).x;
  local_2b8._4_4_ = (vfrac->begin).y;
  uVar45 = (vfrac->end).x;
  uVar46 = (vfrac->end).y;
  LStack_2c0 = vfrac->nstride;
  iStack_2b0 = (int)*(undefined8 *)&(vfrac->begin).z;
  aiStack_2ac[0] = uVar45;
  aiStack_2ac[1] = uVar46;
  uStack_2a4 = *(undefined8 *)&(vfrac->end).z;
  local_298 = itracker->p;
  uStack_290 = itracker->jstride;
  local_288 = itracker->kstride;
  uStack_280 = itracker->nstride;
  local_278._0_4_ = (itracker->begin).x;
  local_278._4_4_ = (itracker->begin).y;
  uVar47 = (itracker->end).x;
  uVar48 = (itracker->end).y;
  uVar18 = *(undefined8 *)&(itracker->end).z;
  iStack_270 = (int)*(undefined8 *)&(itracker->begin).z;
  iStack_26c = uVar47;
  local_268 = uVar48;
  local_264 = (uint)uVar18;
  local_260 = (undefined4)((ulong)uVar18 >> 0x20);
  puVar94 = &DAT_006a4a30;
  plVar100 = &lStack_258;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  piVar84 = &DAT_006a4a9c;
  piVar82 = local_1ec;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *piVar82 = *piVar84;
    piVar84 = piVar84 + 1;
    piVar82 = piVar82 + 1;
  }
  puVar94 = &DAT_006a4b08;
  plVar100 = &local_180;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  local_110 = nrs->p;
  lStack_108 = nrs->jstride;
  local_100 = nrs->kstride;
  local_f0._0_4_ = (nrs->begin).x;
  local_f0._4_4_ = (nrs->begin).y;
  uVar18 = *(undefined8 *)&(nrs->begin).z;
  uVar49 = (nrs->end).y;
  uVar30 = *(undefined8 *)&(nrs->end).z;
  uStack_e0 = uVar49;
  uStack_dc = (undefined4)uVar30;
  uStack_d8 = (undefined4)((ulong)uVar30 >> 0x20);
  iStack_e8 = (int)uVar18;
  uStack_e4 = (undefined4)((ulong)uVar18 >> 0x20);
  lStack_f8 = nrs->nstride;
  if (iVar66 <= iVar67) {
    iVar95 = iVar66;
    do {
      if (iVar69 <= iVar71) {
        lVar83 = (long)iVar95;
        local_560 = (int *)((long)local_298 +
                           (lVar83 - iStack_270) * local_288 * 4 +
                           uStack_280 * 4 +
                           ((long)iVar69 - (long)(int)local_278._4_4_) * uStack_290 * 4 +
                           (long)iVar68 * 4 + (long)(int)(undefined4)local_278 * -4);
        lVar77 = (lVar83 - iStack_2f0) * local_308;
        lVar76 = (lVar83 - iStack_330) * local_348;
        local_608 = (long)iVar69;
        do {
          if (iVar68 <= iVar70) {
            lVar86 = (local_608 - (int)local_2f8._4_4_) * lStack_310;
            lVar93 = (local_608 - (int)local_338._4_4_) * lStack_350;
            local_508 = local_560;
            lVar81 = (long)iVar68;
            do {
              if ((~pEVar19[(lVar83 - iStack_370) * lVar8 +
                            (local_608 - (int)uVar41) * lVar1 + (lVar81 - (int)uVar40)].flag & 3) !=
                  0) {
                lVar75 = lVar81 - (int)(undefined4)local_338;
                local_358[lVar76 + lVar93 + lVar75] =
                     local_318[lVar77 + lVar86 + (lVar81 - (int)(undefined4)local_2f8)] *
                     local_2d8[(iVar95 - iStack_2b0) * local_2c8 +
                               (local_608 - (int)local_2b8._4_4_) * lStack_2d0 +
                               (lVar81 - (int)(undefined4)local_2b8)];
                uVar110 = (ulong)(uint)local_298[(lVar83 - iStack_270) * local_288 +
                                                 (local_608 - (int)local_278._4_4_) * uStack_290 +
                                                 (lVar81 - (int)(undefined4)local_278)];
                if (0 < local_298[(lVar83 - iStack_270) * local_288 +
                                  (local_608 - (int)local_278._4_4_) * uStack_290 +
                                  (lVar81 - (int)(undefined4)local_278)]) {
                  local_5b0 = (int)lVar81;
                  piVar84 = local_508;
                  do {
                    lVar89 = (long)*piVar84;
                    lVar111 = (long)*(int *)((long)&lStack_258 + lVar89 * 4) + (long)local_5b0;
                    lVar88 = (long)local_1ec[lVar89] + (long)(int)local_608;
                    lVar89 = *(int *)((long)&local_180 + lVar89 * 4) + lVar83;
                    local_358[lVar76 + lVar93 + lVar75] =
                         (local_318[lVar77 + lVar86 + (lVar81 - (int)(undefined4)local_2f8) +
                                                      LStack_300] *
                         local_2d8[((int)lVar88 - local_2b8._4_4_) * lStack_2d0 +
                                   (long)((int)lVar111 - (undefined4)local_2b8) +
                                   ((int)lVar89 - iStack_2b0) * local_2c8]) /
                         local_110[(lVar88 - (int)local_f0._4_4_) * lStack_108 +
                                   (lVar111 - (int)(undefined4)local_f0) +
                                   (lVar89 - iStack_e8) * local_100] +
                         local_358[lVar76 + lVar93 + lVar75];
                    piVar84 = piVar84 + uStack_280;
                    uVar110 = uVar110 - 1;
                  } while (uVar110 != 0);
                }
              }
              lVar81 = lVar81 + 1;
              local_508 = local_508 + 1;
            } while (iVar63 != (int)lVar81);
          }
          local_608 = local_608 + 1;
          local_560 = local_560 + uStack_290;
        } while (iVar64 != (int)local_608);
      }
      bVar114 = iVar95 != iVar67;
      iVar95 = iVar95 + 1;
    } while (bVar114);
  }
  pdVar9 = vfrac->p;
  lVar1 = vfrac->jstride;
  lVar8 = vfrac->kstride;
  uVar50 = (vfrac->begin).x;
  uVar51 = (vfrac->begin).y;
  iStack_370 = (int)*(undefined8 *)&(vfrac->begin).z;
  local_358 = cent_hat->p;
  lStack_350 = cent_hat->jstride;
  local_348 = cent_hat->kstride;
  LStack_340 = cent_hat->nstride;
  local_338._0_4_ = (cent_hat->begin).x;
  local_338._4_4_ = (cent_hat->begin).y;
  uVar18 = *(undefined8 *)&(cent_hat->begin).z;
  uVar52 = (cent_hat->end).y;
  uStack_328 = uVar52;
  uStack_324 = *(undefined8 *)&(cent_hat->end).z;
  iStack_330 = (int)uVar18;
  uStack_32c = (undefined4)((ulong)uVar18 >> 0x20);
  local_318 = local_50->p;
  lStack_310 = local_50->jstride;
  local_308 = local_50->kstride;
  LStack_300 = local_50->nstride;
  local_2f8._0_4_ = (local_50->begin).x;
  local_2f8._4_4_ = (local_50->begin).y;
  uVar18 = *(undefined8 *)&(local_50->begin).z;
  uVar53 = (local_50->end).y;
  aiStack_2ec[1] = uVar53;
  uStack_2e4 = *(undefined8 *)&(local_50->end).z;
  iStack_2f0 = (int)uVar18;
  aiStack_2ec[0] = (int)((ulong)uVar18 >> 0x20);
  local_2d8 = (double *)itracker->p;
  lStack_2d0 = itracker->jstride;
  local_2c8 = itracker->kstride;
  LStack_2c0 = itracker->nstride;
  local_2b8._0_4_ = (itracker->begin).x;
  local_2b8._4_4_ = (itracker->begin).y;
  uVar54 = (itracker->end).x;
  uVar55 = (itracker->end).y;
  iStack_2b0 = (int)*(undefined8 *)&(itracker->begin).z;
  aiStack_2ac[0] = uVar54;
  aiStack_2ac[1] = uVar55;
  uStack_2a4 = *(undefined8 *)&(itracker->end).z;
  local_298 = (int *)CONCAT44(iVar91,iVar102);
  uStack_290 = CONCAT44(iVar85,iVar78);
  local_288 = CONCAT44(iVar92,iVar90);
  uStack_280 = CONCAT44(iVar68,uVar6);
  local_278 = CONCAT44(iVar66,iVar69);
  iStack_270 = iVar70;
  iStack_26c = iVar71;
  local_268 = iVar67;
  local_264 = uVar5;
  pdVar10 = alpha->p;
  lStack_258 = alpha->jstride;
  local_250 = alpha->kstride;
  lStack_248 = alpha->nstride;
  local_240._0_4_ = (alpha->begin).x;
  local_240._4_4_ = (alpha->begin).y;
  uVar18 = *(undefined8 *)&(alpha->begin).z;
  uVar56 = (alpha->end).y;
  uStack_230 = uVar56;
  uStack_22c = *(undefined8 *)&(alpha->end).z;
  iStack_238 = (int)uVar18;
  uStack_234 = (undefined4)((ulong)uVar18 >> 0x20);
  local_260 = SUB84(pdVar10,0);
  uStack_25c = (undefined4)((ulong)pdVar10 >> 0x20);
  piVar84 = &DAT_006a4a30;
  piVar82 = local_220;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *piVar82 = *piVar84;
    piVar84 = piVar84 + 1;
    piVar82 = piVar82 + 1;
  }
  puVar94 = &DAT_006a4a9c;
  puVar101 = (undefined4 *)((long)&local_1b8 + 4);
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *puVar101 = *puVar94;
    puVar94 = puVar94 + 1;
    puVar101 = puVar101 + 1;
  }
  piVar84 = &DAT_006a4b08;
  piVar82 = local_148;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *piVar82 = *piVar84;
    piVar84 = piVar84 + 1;
    piVar82 = piVar82 + 1;
  }
  pdVar57 = nrs->p;
  RStack_d0 = (Real)nrs->jstride;
  local_c8 = nrs->kstride;
  local_b8._0_4_ = (nrs->begin).x;
  local_b8._4_4_ = (nrs->begin).y;
  uVar18 = *(undefined8 *)&(nrs->begin).z;
  uVar58 = (nrs->end).y;
  uStack_a8 = uVar58;
  uStack_a4 = *(undefined8 *)&(nrs->end).z;
  local_b0 = (int)uVar18;
  local_ac = (undefined4)((ulong)uVar18 >> 0x20);
  LStack_c0 = nrs->nstride;
  uStack_d8 = SUB84(pdVar57,0);
  uStack_d4 = (undefined4)((ulong)pdVar57 >> 0x20);
  local_98 = nbhd_vol->p;
  lStack_90 = nbhd_vol->jstride;
  local_88 = nbhd_vol->kstride;
  local_78._0_4_ = (nbhd_vol->begin).x;
  local_78._4_4_ = (nbhd_vol->begin).y;
  uVar59 = (nbhd_vol->end).x;
  uVar60 = (nbhd_vol->end).y;
  LStack_80 = nbhd_vol->nstride;
  iStack_70 = (int)*(undefined8 *)&(nbhd_vol->begin).z;
  uStack_6c = uVar59;
  uStack_68 = uVar60;
  uStack_64 = *(undefined8 *)&(nbhd_vol->end).z;
  if (iVar73 <= iVar65) {
    do {
      if (iVar62 <= iVar64) {
        lVar76 = (long)iVar73;
        lVar83 = (iVar73 - iStack_370) * lVar8;
        lVar77 = (long)iVar62;
        do {
          if (iVar61 <= iVar63) {
            lVar86 = (lVar77 - (int)uVar51) * lVar1;
            lVar93 = (lVar77 - (int)local_338._4_4_) * lStack_350;
            lVar88 = (lVar76 - iStack_330) * local_348;
            lVar75 = (lVar77 - (int)local_2b8._4_4_) * lStack_2d0;
            lVar89 = (lVar76 - iStack_2b0) * local_2c8;
            lVar111 = (lVar77 - (int)local_78._4_4_) * lStack_90;
            lVar96 = (lVar76 - iStack_70) * local_88;
            piVar84 = (int *)((long)local_2d8 +
                             ((long)iVar61 +
                             ((LStack_2c0 + lVar75 + lVar89) - (long)(int)(undefined4)local_2b8)) *
                             4);
            lVar81 = (long)iVar61;
            do {
              lVar106 = lVar81 - (int)uVar50;
              if (pdVar9[lVar83 + lVar86 + lVar106] <= 0.0) {
                lVar106 = lVar81 - (int)(undefined4)local_338;
                local_358[lVar93 + lVar88 + lVar106] = 1e+40;
                local_358[lVar93 + lVar88 + lVar106 + LStack_340] = 1e+40;
                local_358[lVar93 + lVar88 + lVar106 + LStack_340 * 2] = 1e+40;
              }
              else {
                pdVar2 = local_318 +
                         (lVar77 - (int)local_2f8._4_4_) * lStack_310 +
                         (iVar73 - iStack_2f0) * local_308 + (lVar81 - (int)(undefined4)local_2f8);
                lVar72 = lVar81 - (int)(undefined4)local_338;
                pdVar87 = local_358 + lVar93 + lVar88 + lVar72;
                local_358[lVar93 + lVar88 + lVar72] = *pdVar2;
                pdVar87[LStack_340] = pdVar2[LStack_300];
                pdVar87[LStack_340 * 2] = pdVar2[LStack_300 * 2];
                uVar110 = (ulong)*(uint *)((long)local_2d8 +
                                          (lVar75 + lVar89 + (lVar81 - (int)(undefined4)local_2b8))
                                          * 4);
                if (((((0 < (int)*(uint *)((long)local_2d8 +
                                          (lVar75 + lVar89 + (lVar81 - (int)(undefined4)local_2b8))
                                          * 4)) && (iVar102 <= lVar81)) && (iVar91 <= lVar77)) &&
                    (((iVar78 <= iVar73 && (lVar81 <= iVar85)) &&
                     ((lVar77 <= iVar90 && ((iVar73 <= iVar92 && (iVar68 <= lVar81)))))))) &&
                   ((iVar69 <= lVar77 &&
                    ((((iVar66 <= iVar73 && (lVar81 <= iVar70)) && (lVar77 <= iVar71)) &&
                     (iVar73 <= iVar67)))))) {
                  pdVar3 = pdVar10 + (lVar77 - (int)local_240._4_4_) * lStack_258 +
                                     (lVar76 - iStack_238) * local_250 +
                                     (lVar81 - (int)(undefined4)local_240);
                  *pdVar87 = *pdVar2 * *pdVar3 * pdVar9[lVar83 + lVar86 + lVar106];
                  pdVar87[LStack_340] =
                       pdVar2[LStack_300] * *pdVar3 * pdVar9[lVar83 + lVar86 + lVar106];
                  pdVar87[LStack_340 * 2] =
                       pdVar2[LStack_300 * 2] * *pdVar3 * pdVar9[lVar83 + lVar86 + lVar106];
                  piVar82 = piVar84;
                  do {
                    lVar106 = (long)*piVar82;
                    iVar95 = *(int *)((long)&local_1b8 + lVar106 * 4 + 4);
                    iVar112 = iVar95 + (int)lVar77;
                    iVar74 = local_148[lVar106];
                    iVar107 = local_220[lVar106] + (int)lVar81;
                    lVar104 = (long)iVar107 - (long)(int)(undefined4)local_b8;
                    lVar113 = ((long)iVar112 - (long)(int)local_b8._4_4_) * (long)RStack_d0;
                    iVar80 = iVar74 + iVar73;
                    pdVar2 = local_318 +
                             ((long)iVar112 - (long)(int)local_2f8._4_4_) * lStack_310 +
                             (long)(iVar107 - (undefined4)local_2f8) +
                             (iVar80 - iStack_2f0) * local_308;
                    lVar72 = (long)(iVar107 - uVar50);
                    lVar108 = (iVar112 - uVar51) * lVar1;
                    lVar105 = (iVar80 - iStack_370) * lVar8;
                    lVar109 = ((long)iVar80 - (long)local_b0) * local_c8;
                    *pdVar87 = (((double)local_220[lVar106] + *pdVar2) * pdVar3[lStack_248] *
                               pdVar9[lVar108 + lVar72 + lVar105]) /
                               pdVar57[lVar113 + lVar104 + lVar109] + *pdVar87;
                    pdVar87[LStack_340] =
                         (((double)iVar95 + pdVar2[LStack_300]) * pdVar3[lStack_248] *
                         pdVar9[lVar108 + lVar72 + lVar105]) / pdVar57[lVar113 + lVar104 + lVar109]
                         + pdVar87[LStack_340];
                    pdVar87[LStack_340 * 2] =
                         (((double)iVar74 + pdVar2[LStack_300 * 2]) * pdVar3[lStack_248] *
                         pdVar9[lVar108 + lVar72 + lVar105]) / pdVar57[lVar113 + lVar104 + lVar109]
                         + pdVar87[LStack_340 * 2];
                    piVar82 = piVar82 + LStack_2c0;
                    uVar110 = uVar110 - 1;
                  } while (uVar110 != 0);
                  lVar106 = lVar81 - (int)(undefined4)local_78;
                  *pdVar87 = *pdVar87 / local_98[lVar111 + lVar96 + lVar106];
                  pdVar87[LStack_340] = pdVar87[LStack_340] / local_98[lVar111 + lVar96 + lVar106];
                  pdVar87[LStack_340 * 2] =
                       pdVar87[LStack_340 * 2] / local_98[lVar111 + lVar96 + lVar106];
                }
              }
              lVar81 = lVar81 + 1;
              piVar84 = piVar84 + 1;
            } while (iVar4 + 4 != (int)lVar81);
          }
          lVar77 = lVar77 + 1;
        } while (iVar79 != (int)lVar77);
      }
      bVar114 = iVar73 != iVar65;
      iVar73 = iVar73 + 1;
    } while (bVar114);
  }
  return;
}

Assistant:

void
Redistribution::MakeStateRedistUtils ( Box const& bx,
                                       Array4<EBCellFlag const> const& flag,
                                       Array4<Real const> const& vfrac,
                                       Array4<Real const> const& ccent,
                                       Array4<int  const> const& itracker,
                                       Array4<Real      > const& nrs,
                                       Array4<Real      > const& alpha,
                                       Array4<Real      > const& nbhd_vol,
                                       Array4<Real      > const& cent_hat,
                                       Geometry const& lev_geom,
                                       Real target_vol)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    Array<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    Array<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    Array<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    Array<int,27>    imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    Array<int,27>    jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    Array<int,27>    kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);
    Box const& bxg4 = amrex::grow(bx,4);

    const Box domain = lev_geom.Domain();

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // Everyone is in their own neighborhood at least
        nrs(i,j,k) = 1.;
        alpha(i,j,k,0) = 1.;
        alpha(i,j,k,1) = 1.;
    });

    // nrs captures how many neighborhoods (r,s) is in
    amrex::ParallelFor(bxg4,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
        for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
        {
            int r = i+imap[itracker(i,j,k,i_nbor)];
            int s = j+jmap[itracker(i,j,k,i_nbor)];
            int t = k+kmap[itracker(i,j,k,i_nbor)];
            if ( domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))) &&
                 bxg3.contains(IntVect(AMREX_D_DECL(r,s,t))) )
            {
                amrex::Gpu::Atomic::Add(&nrs(r,s,t),1.0_rt);
            }
        }
    });

    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // Start with the vfrac of (i,j,k)
            nbhd_vol(i,j,k) = vfrac(i,j,k) / nrs(i,j,k);
            Real vol_of_nbors = 0.;

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),vfrac(r,s,t) / nrs(r,s,t));
                vol_of_nbors += vfrac(r,s,t);
            }

            if (itracker(i,j,k,0) > 0)
                alpha(i,j,k,1) = (target_vol - vfrac(i,j,k)) / vol_of_nbors;

        } else {
            nbhd_vol(i,j,k) = 0.;
            alpha(i,j,k,0) = 0.;
            alpha(i,j,k,1) = 0.;
        }
    });

    // Define how much each cell keeps
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&alpha(r,s,t,0),-(alpha(i,j,k,1)/nrs(r,s,t)));
            }
        }
    });

    // Redefine nbhd_vol
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            nbhd_vol(i,j,k)  = alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t));
            }
        }
    });

    // Define xhat,yhat,zhat (from Berger and Guliani)
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0);,
                         cent_hat(i,j,k,1) = ccent(i,j,k,1);,
                         cent_hat(i,j,k,2) = ccent(i,j,k,2););

            if ( itracker(i,j,k,0) > 0 &&
                 domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))) &&
                             bxg2.contains(IntVect(AMREX_D_DECL(i,j,k))) ) {

                AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,1) = ccent(i,j,k,1) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,2) = ccent(i,j,k,2) * alpha(i,j,k,0) *vfrac(i,j,k););

                // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
                {
                    int ii = imap[itracker(i,j,k,i_nbor)]; int r = i+ii;
                    int jj = jmap[itracker(i,j,k,i_nbor)]; int s = j+jj;
                    int kk = kmap[itracker(i,j,k,i_nbor)]; int t = k+kk;

                    AMREX_D_TERM(cent_hat(i,j,k,0) += (ccent(r,s,t,0) + ii) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,1) += (ccent(r,s,t,1) + jj) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,2) += (ccent(r,s,t,2) + kk) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t););
                }

                AMREX_D_TERM(cent_hat(i,j,k,0) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,1) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,2) /= nbhd_vol(i,j,k););
            }
        } else {

                AMREX_D_TERM(cent_hat(i,j,k,0) = 1.e40;,
                             cent_hat(i,j,k,1) = 1.e40;,
                             cent_hat(i,j,k,2) = 1.e40;);
        }
    });
}